

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O0

variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
* __thiscall
strq::Generator<std::variant<double,std::__cxx11::string,int>,void>::operator()
          (variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,
          Generator<std::variant<double,std::__cxx11::string,int>,void> *this,
          Compound<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
          *schema)

{
  tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>_>
  *this_00;
  tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>_>
  *lhs;
  TypeWrapper<int> *__elements_2;
  anon_class_8_1_91774365 local_b0;
  anon_class_8_1_91774365 assign_random;
  undefined1 local_a0 [8];
  tuple<std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
  types_and_schemas;
  undefined1 local_48 [7];
  tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>_>
  types;
  Arithmetic<std::uniform_int_distribution<unsigned_long>_> local_38;
  unsigned_long local_28;
  unsigned_long choice;
  Compound<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
  *schema_local;
  Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
  *this_local;
  variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *variant;
  
  choice = (unsigned_long)schema;
  schema_local = (Compound<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
                  *)this;
  this_local = (Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
                *)__return_storage_ptr__;
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_48,0,3);
  Arithmetic<std::uniform_int_distribution<unsigned_long>_>::Arithmetic
            (&local_38,(uniform_int_distribution<unsigned_long> *)local_48);
  local_28 = random<unsigned_long,strq::Arithmetic<std::uniform_int_distribution<unsigned_long>>>
                       (&local_38);
  this_00 = (tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>_>
             *)&types_and_schemas.
                super__Tuple_impl<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
                .
                super__Head_base<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_false>
                ._M_head_impl.second._dist.field_0x1f;
  __elements_2 = (TypeWrapper<int> *)
                 &types_and_schemas.
                  super__Tuple_impl<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
                  .
                  super__Head_base<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_false>
                  ._M_head_impl.second._dist.field_0x1c;
  std::
  tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>_>
  ::
  tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_true,_true>
            (this_00,(TypeWrapper<double> *)
                     &types_and_schemas.
                      super__Tuple_impl<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
                      .
                      super__Head_base<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_false>
                      ._M_head_impl.second._dist.field_0x1e,
             (TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&types_and_schemas.
                 super__Tuple_impl<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
                 .
                 super__Head_base<0UL,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_false>
                 ._M_head_impl.second._dist.field_0x1d,__elements_2);
  lhs = (tuple<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>_>
         *)Compound<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
           ::values((Compound<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
                     *)choice);
  detail::
  zip<strq::Generator<std::variant<double,std::__cxx11::string,int>,void>::TypeWrapper<double>,strq::Generator<std::variant<double,std::__cxx11::string,int>,void>::TypeWrapper<std::__cxx11::string>,strq::Generator<std::variant<double,std::__cxx11::string,int>,void>::TypeWrapper<int>,strq::Arithmetic<std::normal_distribution<double>>,strq::Container<strq::Arithmetic<strq::detail::NoDistribution>>,strq::Arithmetic<std::uniform_int_distribution<int>>>
            ((tuple<std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
              *)local_a0,(detail *)this_00,lhs,
             (tuple<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
              *)__elements_2);
  assign_random.variant._7_1_ = 0;
  std::
  variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::variant(__return_storage_ptr__);
  local_b0.variant = __return_storage_ptr__;
  operator()(&local_b0,
             (tuple<std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
              *)local_a0,local_28);
  return __return_storage_ptr__;
}

Assistant:

auto operator() (Schema&& schema) -> std::variant<Ts...>
        {
            static_assert(detail::trait::is_template_instantiation<Schema, Compound>,
                          "Schema for std::variant should be Compound");

            const auto choice = random<std::size_t> (
                    Arithmetic{std::uniform_int_distribution{std::size_t{0}, sizeof...(Ts)}}
            );

            const auto types = std::tuple {TypeWrapper<Ts>{}...};
            const auto types_and_schemas = detail::zip(types, schema.values());

            std::variant <Ts...> variant;

            const auto assign_random = [&] (const auto& type_and_schema) {
                variant = random <typename std::decay_t<decltype(type_and_schema.first)>::type> (type_and_schema.second);
            };

            invoke_with_nth_elem(assign_random, types_and_schemas, choice);
            return variant;
        }